

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void Serialize<HashedSourceWriter<DataStream>,char>
               (HashedSourceWriter<DataStream> *os,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  long lVar1;
  size_t len;
  uchar *data;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<HashedSourceWriter<DataStream>>(os,str->_M_string_length);
  len = str->_M_string_length;
  if (len == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    data = (uchar *)(str->_M_dataplus)._M_p;
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_source,
               (os->m_source->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,data,data + len);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      CSHA256::Write((CSHA256 *)os,data,len);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::basic_string<C>& str)
{
    WriteCompactSize(os, str.size());
    if (!str.empty())
        os.write(MakeByteSpan(str));
}